

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall
Catch::AutomakeReporter::testCaseEnded(AutomakeReporter *this,TestCaseStats *_testCaseStats)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  
  std::operator<<((this->super_StreamingReporterBase).super_ReporterBase.m_stream,":test-result: ");
  if ((_testCaseStats->totals).testCases.skipped == 0) {
    bVar1 = Counts::allPassed(&(_testCaseStats->totals).assertions);
    if (bVar1) {
      poVar2 = (this->super_StreamingReporterBase).super_ReporterBase.m_stream;
      pcVar3 = "PASS";
    }
    else {
      poVar2 = (this->super_StreamingReporterBase).super_ReporterBase.m_stream;
      if ((_testCaseStats->totals).assertions.failed == 0) {
        pcVar3 = "XFAIL";
      }
      else {
        pcVar3 = "FAIL";
      }
    }
  }
  else {
    poVar2 = (this->super_StreamingReporterBase).super_ReporterBase.m_stream;
    pcVar3 = "SKIP";
  }
  std::operator<<(poVar2,pcVar3);
  poVar2 = std::operator<<((this->super_StreamingReporterBase).super_ReporterBase.m_stream,' ');
  poVar2 = std::operator<<(poVar2,(string *)_testCaseStats->testInfo);
  std::operator<<(poVar2,'\n');
  (this->super_StreamingReporterBase).currentTestCaseInfo = (TestCaseInfo *)0x0;
  return;
}

Assistant:

void AutomakeReporter::testCaseEnded(TestCaseStats const& _testCaseStats) {
        // Possible values to emit are PASS, XFAIL, SKIP, FAIL, XPASS and ERROR.
        m_stream << ":test-result: ";
        if ( _testCaseStats.totals.testCases.skipped > 0 ) {
            m_stream << "SKIP";
        } else if (_testCaseStats.totals.assertions.allPassed()) {
            m_stream << "PASS";
        } else if (_testCaseStats.totals.assertions.allOk()) {
            m_stream << "XFAIL";
        } else {
            m_stream << "FAIL";
        }
        m_stream << ' ' << _testCaseStats.testInfo->name << '\n';
        StreamingReporterBase::testCaseEnded(_testCaseStats);
    }